

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# YAMLParser.cpp
# Opt level: O0

void __thiscall llvm::yaml::Scanner::removeStaleSimpleKeyCandidates(Scanner *this)

{
  void *pvVar1;
  iterator pSVar2;
  size_t sVar3;
  pointer pTVar4;
  iterator Position;
  Twine local_48;
  iterator local_30;
  iterator i;
  Scanner *this_local;
  SmallVector<(anonymous_namespace)::SimpleKey,_4U> *local_18;
  SmallVector<(anonymous_namespace)::SimpleKey,_4U> *local_10;
  
  this_local = (Scanner *)&this->SimpleKeys;
  local_30 = (iterator)
             (((SmallVector<(anonymous_namespace)::SimpleKey,_4U> *)this_local)->
             super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>).
             super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
             super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
             super_SmallVectorBase.BeginX;
  i = (iterator)this;
  while( true ) {
    pSVar2 = local_30;
    local_18 = &this->SimpleKeys;
    pvVar1 = (local_18->super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>).
             super_SmallVectorTemplateBase<(anonymous_namespace)::SimpleKey,_true>.
             super_SmallVectorTemplateCommon<(anonymous_namespace)::SimpleKey,_void>.
             super_SmallVectorBase.BeginX;
    local_10 = local_18;
    sVar3 = SmallVectorBase::size((SmallVectorBase *)local_18);
    if (pSVar2 == (iterator)((long)pvVar1 + sVar3 * 0x18)) break;
    if ((local_30->Line == this->Line) && (this->Column <= local_30->Column + 0x400)) {
      local_30 = local_30 + 1;
    }
    else {
      if ((local_30->IsRequired & 1U) != 0) {
        Twine::Twine(&local_48,"Could not find expected : for simple key");
        pTVar4 = AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>
                 ::
                 IteratorImpl<llvm::yaml::Token,_llvm::ilist_iterator<llvm::ilist_detail::node_options<llvm::AllocatorList<llvm::yaml::Token,_llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,_4096UL,_4096UL>_>::Node,_false,_false,_void>,_false,_false>_>
                 ::operator->(&local_30->Tok);
        Position = StringRef::begin(&pTVar4->Range);
        setError(this,&local_48,Position);
      }
      local_30 = SmallVectorImpl<(anonymous_namespace)::SimpleKey>::erase
                           (&(this->SimpleKeys).
                             super_SmallVectorImpl<(anonymous_namespace)::SimpleKey>,local_30);
    }
  }
  return;
}

Assistant:

void Scanner::removeStaleSimpleKeyCandidates() {
  for (SmallVectorImpl<SimpleKey>::iterator i = SimpleKeys.begin();
                                            i != SimpleKeys.end();) {
    if (i->Line != Line || i->Column + 1024 < Column) {
      if (i->IsRequired)
        setError( "Could not find expected : for simple key"
                , i->Tok->Range.begin());
      i = SimpleKeys.erase(i);
    } else
      ++i;
  }
}